

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

Curl_dns_entry * Curl_fetch_addr(connectdata *conn,char *hostname,int port,int *stale)

{
  SessionHandle *data_00;
  int iVar1;
  char *__s;
  size_t sVar2;
  SessionHandle *data;
  size_t entry_len;
  Curl_dns_entry *dns;
  char *entry_id;
  int *stale_local;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  __s = create_hostcache_id(hostname,port);
  if (__s == (char *)0x0) {
    conn_local = (connectdata *)0x0;
  }
  else {
    sVar2 = strlen(__s);
    entry_len = (size_t)Curl_hash_pick((data_00->dns).hostcache,__s,sVar2 + 1);
    (*Curl_cfree)(__s);
    iVar1 = remove_entry_if_stale(data_00,(Curl_dns_entry *)entry_len);
    *stale = iVar1;
    if (*stale != 0) {
      entry_len = 0;
    }
    conn_local = (connectdata *)entry_len;
  }
  return (Curl_dns_entry *)conn_local;
}

Assistant:

struct Curl_dns_entry *
Curl_fetch_addr(struct connectdata *conn,
                const char *hostname,
                int port, int *stale)
{
  char *entry_id = NULL;
  struct Curl_dns_entry *dns = NULL;
  size_t entry_len;
  struct SessionHandle *data = conn->data;

  /* Create an entry id, based upon the hostname and port */
  entry_id = create_hostcache_id(hostname, port);
  /* If we can't create the entry id, fail */
  if(!entry_id)
    return dns;

  entry_len = strlen(entry_id);

  /* See if its already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len+1);

  /* free the allocated entry_id again */
  free(entry_id);

  /* See whether the returned entry is stale. Done before we release lock */
  *stale = remove_entry_if_stale(data, dns);
  if(*stale)
    dns = NULL; /* the memory deallocation is being handled by the hash */

  return dns;
}